

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstXmlLang(xmlTextReaderPtr reader)

{
  xmlChar *name;
  xmlChar *ret;
  xmlChar *tmp;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    name = xmlNodeGetLang(reader->node);
    if (name == (xmlChar *)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      reader_local = (xmlTextReaderPtr)xmlDictLookup(reader->dict,name,-1);
      (*xmlFree)(name);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstXmlLang(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    tmp = xmlNodeGetLang(reader->node);
    if (tmp == NULL)
        return(NULL);
    ret = CONSTSTR(tmp);
    xmlFree(tmp);
    return(ret);
}